

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectSBGx(SBG *pSBG,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  SBG *pSBG_local;
  
  local_24 = 0;
  do {
    if (addrsSBG[local_24] == (void *)0x0) {
      iVar1 = ConnectSBG(pSBG,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSBG[local_24] = pSBG;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectSBGx(SBG* pSBG, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectSBG(pSBG, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsSBG[id] = pSBG;

	return EXIT_SUCCESS;
}